

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O2

void __thiscall
diy::Master::foreach<diy::detail::ReductionFunctor<Block,diy::detail::KDTreePartners>>
          (Master *this,ReductionFunctor<Block,_diy::detail::KDTreePartners> *f,Skip *s)

{
  Callback<Block> CStack_38;
  
  std::function<void(Block*,diy::Master::ProxyWithLink_const&)>::
  function<diy::detail::ReductionFunctor<Block,diy::detail::KDTreePartners>const&,void>
            ((function<void(Block*,diy::Master::ProxyWithLink_const&)> *)&CStack_38,f);
  foreach_<Block>(this,&CStack_38,s);
  Catch::clara::std::_Function_base::~_Function_base(&CStack_38.super__Function_base);
  return;
}

Assistant:

void          foreach(const F& f, const Skip& s = NeverSkip())
      {
          using Block = typename detail::block_traits<F>::type;
          foreach_<Block>(f, s);
      }